

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttocsv.cpp
# Opt level: O2

void footprinttocsv::doit
               (bool skipheader,int from_event,int to_event,char *binFileName,char *idxFileName)

{
  int event_id;
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar1;
  undefined7 in_register_00000039;
  EventIndex idx;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("event_id, areaperil_id, intensity_bin_id, probability");
  }
  __stream = fopen(binFileName,"rb");
  __stream_00 = fopen(idxFileName,"rb");
  if (__stream_00 == (FILE *)0x0) {
    fwrite("FATAL: Footprint idx open failed\n",0x21,1,_stderr);
    exit(3);
  }
  while (sVar1 = fread(&idx,0x14,1,__stream_00), event_id = idx.event_id, sVar1 != 0) {
    if ((to_event == 0 && from_event == 0) ||
       (idx.event_id <= to_event && from_event <= idx.event_id)) {
      fseek(__stream,idx.offset,0);
      printrows(event_id,(FILE *)__stream,idx.size);
    }
  }
  fclose(__stream);
  fclose(__stream_00);
  return;
}

Assistant:

void doit(bool skipheader, int from_event, int to_event, const char * binFileName="footprint.bin", const char * idxFileName="footprint.idx")
	{
		if (skipheader == false)  printf("event_id, areaperil_id, intensity_bin_id, probability\n");
		bool no_event_range = ( (from_event == to_event) && (from_event == 0) );
		FILE *finx = fopen(binFileName, "rb");
		FILE *finy = fopen(idxFileName, "rb");

		EventIndex idx;

		if (finy == nullptr) {
			fprintf(stderr, "FATAL: Footprint idx open failed\n");
			exit(3);
		}
		size_t i = fread(&idx, sizeof(idx), 1, finy);
		while (i != 0) {
			if ((no_event_range) ||
			    (idx.event_id >= from_event && idx.event_id <= to_event)) {
				flseek(finx, idx.offset, SEEK_SET);
				printrows(idx.event_id, finx, idx.size);
			}
			i = fread(&idx, sizeof(idx), 1, finy);
		}

		fclose(finx);
		fclose(finy);
	}